

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::ReadableDirectory> __thiscall
kj::ReadableDirectory::openSubdir(ReadableDirectory *this,PathPtr path)

{
  Clock *params;
  InMemoryDirectory *extraout_RDX;
  InMemoryDirectory *pIVar1;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar2;
  Own<const_kj::ReadableDirectory> OVar3;
  Fault f;
  _func_int **local_28;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x58))(&f);
  pIVar1 = extraout_RDX;
  if (local_28 == (_func_int **)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x230,FAILED,(char *)0x0,"\"no such file or directory\", path",
               (char (*) [26])"no such file or directory",&path_local);
    kj::_::Debug::Fault::~Fault(&f);
    params = nullClock();
    OVar2 = atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                      ((kj *)&f,params);
    pIVar1 = OVar2.ptr;
  }
  (this->super_FsNode)._vptr_FsNode = (_func_int **)f.exception;
  this[1].super_FsNode._vptr_FsNode = local_28;
  OVar3.ptr = (ReadableDirectory *)pIVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const ReadableDirectory> ReadableDirectory::openSubdir(PathPtr path) const {
  KJ_IF_MAYBE(dir, tryOpenSubdir(path)) {
    return kj::mv(*dir);
  } else {
    KJ_FAIL_REQUIRE("no such file or directory", path) { break; }